

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void copyFile(string *from,string *to)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string *in_RSI;
  string *in_RDI;
  string command2;
  string command;
  string override_permission;
  bool override;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  char *local_228;
  string *in_stack_fffffffffffffde8;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [39];
  byte local_11;
  string *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_11 = Settings::canOverwriteFiles();
  bVar1 = std::operator!=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if (((bVar1) && ((local_11 & 1) == 0)) && (bVar1 = fileExists(in_stack_fffffffffffffde8), bVar1))
  {
    poVar4 = std::operator<<((ostream *)&std::cerr,"\n\nError : File ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," already exists. Remove it or enable overwriting.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if ((local_11 & 1) == 0) {
    local_228 = "-n ";
  }
  else {
    local_228 = "-f ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_228,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"cp ",&local_131);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"\"",&local_159);
  std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"\" \"",&local_181);
  std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"\"",&local_1a9);
  std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  bVar1 = std::operator!=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if ((bVar1) && (iVar2 = systemp(in_stack_fffffffffffffd60), iVar2 != 0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "\n\nError : An error occured while trying to copy file ");
    poVar4 = std::operator<<(poVar4,local_8);
    poVar4 = std::operator<<(poVar4," to ");
    poVar4 = std::operator<<(poVar4,local_10);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"chmod +w \"",(allocator *)&stack0xfffffffffffffdef);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
  iVar2 = systemp(in_stack_fffffffffffffd60);
  if (iVar2 == 0) {
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "\n\nError : An error occured while trying to set write permissions on file "
                          );
  poVar4 = std::operator<<(poVar4,local_10);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void copyFile(const string& from, const string& to)
{
    bool override = Settings::canOverwriteFiles();
    if( from != to && !override )
    {
        if(fileExists( to ))
        {
            cerr << "\n\nError : File " << to.c_str() << " already exists. Remove it or enable overwriting." << endl;
            exit(1);
        }
    }

    string override_permission = string(override ? "-f " : "-n ");
        
    // copy file to local directory
    string command = string("cp ") + override_permission + string("\"") + from + string("\" \"") + to + string("\"");
    if( from != to && systemp( command ) != 0 )
    {
        cerr << "\n\nError : An error occured while trying to copy file " << from << " to " << to << endl;
        exit(1);
    }
    
    // give it write permission
    string command2 = string("chmod +w \"") + to + "\"";
    if( systemp( command2 ) != 0 )
    {
        cerr << "\n\nError : An error occured while trying to set write permissions on file " << to << endl;
        exit(1);
    }
}